

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O3

void MapIncludesToDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *includeLookup,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *ambiguous,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
               *files)

{
  _Base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  mapped_type pCVar3;
  size_type sVar4;
  int iVar5;
  const_iterator cVar6;
  iterator iVar7;
  mapped_type *__k;
  long lVar8;
  mapped_type *this;
  long *plVar9;
  mapped_type *ppCVar10;
  _Rb_tree_node_base *p_Var11;
  char *pcVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Base_ptr p_Var14;
  File *dep;
  string lowercaseInclude;
  File *dep_1;
  __hashtable *__h;
  string fullFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_f8 [2];
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  local_e8 [16];
  _Hash_node_base *local_d8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d0;
  key_type local_c8;
  mapped_type local_a8 [2];
  undefined1 local_98 [24];
  key_type local_80;
  undefined8 local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_58;
  value_type *local_50;
  __node_base local_48;
  _Hash_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  local_40 = (files->_M_h)._M_before_begin._M_nxt;
  if (local_40 != (_Hash_node_base *)0x0) {
    local_d0 = &files->_M_h;
    local_60 = components;
    local_58 = ambiguous;
    local_48._M_nxt = (_Hash_node_base *)includeLookup;
    do {
      p_Var11 = (_Rb_tree_node_base *)local_40[0xc]._M_nxt;
      local_38 = (_Rb_tree_node_base *)(local_40 + 10);
      if (p_Var11 != local_38) {
        local_50 = (value_type *)(local_40 + 1);
        local_98._16_8_ = local_40 + 0xf;
        local_d8 = local_40 + 0x1d;
        do {
          local_f8[0] = local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,local_40[1]._M_nxt,
                     (long)&(local_40[1]._M_nxt)->_M_nxt + (long)&(local_40[2]._M_nxt)->_M_nxt);
          boost::filesystem::path::parent_path();
          local_a8[0] = (mapped_type)local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          boost::filesystem::path::operator/=((path *)&local_118,(path *)local_a8);
          sVar4 = local_118._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            local_c8.field_2._8_4_ = local_118.field_2._8_4_;
            local_c8.field_2._12_4_ = local_118.field_2._12_4_;
            local_118._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          local_c8.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
          local_c8._M_string_length = local_118._M_string_length;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity =
               local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pcVar12 = local_118._M_dataplus._M_p + (long)(_Hash_node_base **)sVar4;
          local_c8._M_dataplus._M_p = local_118._M_dataplus._M_p;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          local_80._M_dataplus._M_p = local_98 + 0x28;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_98 + 0x18),local_c8._M_dataplus._M_p,pcVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_a8[0] != (mapped_type)local_98) {
            operator_delete(local_a8[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if (local_f8[0] != local_e8) {
            operator_delete(local_f8[0]);
          }
          if (((char)p_Var11[2]._M_color == _S_red) &&
             (cVar6 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(local_d0,(key_type *)(local_98 + 0x18)),
             cVar6.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
             ._M_cur != (__node_type *)0x0)) {
            iVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_d0,(key_type *)(local_98 + 0x18));
            local_118._M_dataplus._M_p =
                 (pointer)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                 ._M_cur + 0x28);
            *(undefined1 *)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                    ._M_cur + 0x101) = 1;
            local_c8._M_dataplus._M_p = (pointer)local_98._16_8_;
            std::
            _Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<File*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<File*,false>>>>
                      ((_Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_98._16_8_,&local_118,&local_c8);
          }
          else {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_allocated_capacity =
                 local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            p_Var1 = p_Var11[1]._M_parent;
            if (p_Var1 != (_Base_ptr)0x0) {
              lVar8 = *(long *)(p_Var11 + 1);
              p_Var14 = (_Base_ptr)0x0;
              do {
                tolower((int)*(char *)((long)&p_Var14->_M_color + lVar8));
                std::__cxx11::string::push_back((char)&local_c8);
                p_Var14 = (_Base_ptr)((long)&p_Var14->_M_color + 1);
              } while (p_Var1 != p_Var14);
            }
            __k = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_48._M_nxt,&local_c8);
            iVar5 = std::__cxx11::string::compare((char *)__k);
            if (iVar5 == 0) {
              this = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](local_58,&local_c8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this,local_50);
            }
            else {
              lVar8 = std::__cxx11::string::find((char *)__k,0x12e0f6,0);
              if (lVar8 == 0) {
                p_Var2 = local_d8->_M_nxt;
                if (p_Var2 != (_Hash_node_base *)0x0) {
                  std::__cxx11::string::substr((ulong)&local_118,(ulong)__k);
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)(p_Var2 + 0x2b),&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  std::__cxx11::string::substr((ulong)local_f8,(ulong)__k);
                  plVar9 = (long *)std::__cxx11::string::replace
                                             ((ulong)local_f8,0,(char *)0x0,0x12c55b);
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar9 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9 == paVar13) {
                    local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_118.field_2._8_8_ = plVar9[3];
                  }
                  else {
                    local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_118._M_dataplus._M_p = (pointer)*plVar9;
                  }
                  local_118._M_string_length = plVar9[1];
                  *plVar9 = (long)paVar13;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ppCVar10 = std::__detail::
                             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                           *)local_60,&local_118);
                  pCVar3 = *ppCVar10;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  if (local_f8[0] != local_e8) {
                    operator_delete(local_f8[0]);
                  }
                  local_a8[0] = pCVar3;
                  if (pCVar3 != (mapped_type)0x0) {
                    local_118._M_dataplus._M_p = (pointer)(local_d8->_M_nxt + 0xf);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_118._M_dataplus._M_p,local_a8,&local_118);
                  }
                }
              }
              else {
                cVar6 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(local_d0,__k);
                if (cVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  iVar7 = std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(local_d0,__k);
                  local_a8[0] = (mapped_type)
                                ((long)iVar7.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                       ._M_cur + 0x28);
                  local_118._M_dataplus._M_p = (pointer)local_98._16_8_;
                  std::
                  _Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<File*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<File*,false>>>>
                            ((_Hashtable<File*,File*,std::allocator<File*>,std::__detail::_Identity,std::equal_to<File*>,std::hash<File*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)local_98._16_8_,local_a8,&local_118);
                  std::__cxx11::string::substr((ulong)&local_118,(ulong)__k);
                  p_Var2 = (local_a8[0]->pubLinks)._M_h._M_before_begin._M_nxt[1]._M_nxt;
                  pcVar12 = ".";
                  if ((_Hash_node_base *)local_118._M_string_length == p_Var2) {
LAB_0011f4fa:
                    std::__cxx11::string::_M_replace
                              ((ulong)&local_118,0,(char *)local_118._M_string_length,(ulong)pcVar12
                              );
                  }
                  else {
                    if (local_118._M_string_length <=
                        (_Hash_node_base *)((long)&p_Var2->_M_nxt + 1U)) {
                      pcVar12 = "";
                      goto LAB_0011f4fa;
                    }
                    std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_118);
                    std::__cxx11::string::operator=((string *)&local_118,(string *)local_f8);
                    if (local_f8[0] != local_e8) {
                      operator_delete(local_f8[0]);
                    }
                  }
                  if ((_Hash_node_base *)local_118._M_string_length != (_Hash_node_base *)0x0) {
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)&(local_a8[0]->privDeps)._M_h._M_before_begin;
                    std::
                    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                              (local_f8[0],&local_118,local_f8);
                  }
                  if (local_d8->_M_nxt != (local_a8[0]->pubLinks)._M_h._M_before_begin._M_nxt) {
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)(local_d8->_M_nxt + 0xf);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_f8[0],&(local_a8[0]->pubLinks)._M_h._M_before_begin,local_f8
                              );
                    local_f8[0] = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)((local_a8[0]->pubLinks)._M_h._M_before_begin._M_nxt + 0x1d);
                    std::
                    _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                              ((_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)local_f8[0],local_d8,local_f8);
                    *(undefined1 *)&(local_a8[0]->pubLinks)._M_h._M_rehash_policy._M_next_resize = 1
                    ;
                  }
                  *(undefined1 *)
                   ((long)&(local_a8[0]->pubLinks)._M_h._M_rehash_policy._M_next_resize + 1) = 1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
          }
          if (local_80._M_dataplus._M_p != local_98 + 0x28) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != local_38);
      }
      local_40 = local_40->_M_nxt;
    } while (local_40 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void MapIncludesToDependencies(std::unordered_map<std::string, std::string> &includeLookup,
                               std::map<std::string, std::vector<std::string>> &ambiguous,
                               std::unordered_map<std::string, Component *> &components, 
                               std::unordered_map<std::string, File>& files) {
    for (auto &fp : files) {
        for (auto &p : fp.second.rawIncludes) {
            // If this is a non-pointy bracket include, see if there's a local match first. 
            // If so, it always takes precedence, never needs an include path added, and never is ambiguous (at least, for the compiler).
            std::string fullFilePath = (filesystem::path(fp.first).parent_path() / p.first).generic_string();
            if (!p.second && files.count(fullFilePath)) {
                // This file exists as a local include.
                File* dep = &files.find(fullFilePath)->second;
                dep->hasInclude = true;
                fp.second.dependencies.insert(dep);
            } else {
                // We need to use an include path to find this. So let's see where we end up.
                std::string lowercaseInclude;
                std::transform(p.first.begin(), p.first.end(), std::back_inserter(lowercaseInclude), ::tolower);
                const std::string &fullPath = includeLookup[lowercaseInclude];
                if (fullPath == "INVALID") {
                    // We end up in more than one place. That's an ambiguous include then.
                    ambiguous[lowercaseInclude].push_back(fp.first);
                } else if (fullPath.find("GENERATED:") == 0) {
                    // We end up in a virtual file - it's not actually there yet, but it'll be generated.
                    if (fp.second.component) {
                        fp.second.component->buildAfters.insert(fullPath.substr(10));
                        Component *c = components["./" + fullPath.substr(10)];
                        if (c) {
                            fp.second.component->privDeps.insert(c);
                        }
                    }
                } else if (files.count(fullPath)) {
                    File *dep = &files.find(fullPath)->second;
                    fp.second.dependencies.insert(dep);

                    std::string inclpath = fullPath.substr(0, fullPath.size() - p.first.size() - 1);
                    if (inclpath.size() == dep->component->root.generic_string().size()) {
                        inclpath = ".";
                    } else if (inclpath.size() > dep->component->root.generic_string().size() + 1) {
                        inclpath = inclpath.substr(dep->component->root.generic_string().size() + 1);
                    } else {
                        inclpath = "";
                    }
                    if (!inclpath.empty()) {
                        dep->includePaths.insert(inclpath);
                    }

                    if (fp.second.component != dep->component) {
                        fp.second.component->privDeps.insert(dep->component);
                        dep->component->privLinks.insert(fp.second.component);
                        dep->hasExternalInclude = true;
                    }
                    dep->hasInclude = true;
                }
                // else we don't know about it. Probably a system include of some sort.
            }
        }
    }
}